

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

int * __thiscall
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::addNode
          (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,BSTNode **t,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          bool *heightFlag)

{
  int iVar1;
  BSTNode *this_00;
  bool local_59;
  uint local_44;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *pMStack_40;
  int bfDelta;
  int *vp;
  int sign;
  bool *heightFlag_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  BSTNode **t_local;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *this_local;
  
  *heightFlag = false;
  if (*t == (BSTNode *)0x0) {
    this_00 = (BSTNode *)operator_new(0x40);
    memset(this_00,0,0x40);
    BSTNode::BSTNode(this_00);
    *t = this_00;
    std::__cxx11::string::operator=((string *)*t,(string *)key);
    (*t)->value = 0;
    (*t)->bf = 0;
    (*t)->right = (BSTNode *)0x0;
    (*t)->left = (BSTNode *)0x0;
    *heightFlag = true;
    this->nodeCount = this->nodeCount + 1;
    this_local = (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  *)&(*t)->value;
  }
  else {
    iVar1 = compareKeys(this,key,&(*t)->key);
    if (iVar1 == 0) {
      this_local = (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                    *)&(*t)->value;
    }
    else {
      local_44 = 0;
      if (iVar1 < 0) {
        pMStack_40 = (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      *)addNode(this,&(*t)->left,key,heightFlag);
        if ((*heightFlag & 1U) != 0) {
          local_44 = 0xffffffff;
        }
      }
      else {
        pMStack_40 = (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      *)addNode(this,&(*t)->right,key,heightFlag);
        local_44 = (uint)((*heightFlag & 1U) != 0);
      }
      updateBF(this,t,local_44);
      local_59 = false;
      if (local_44 != 0) {
        local_59 = (*t)->bf != 0;
      }
      *heightFlag = local_59;
      this_local = pMStack_40;
    }
  }
  return (int *)this_local;
}

Assistant:

ValueType *addNode(BSTNode * & t, const KeyType & key, bool & heightFlag) {
      heightFlag = false;
      if (t == NULL)  {
         t = new BSTNode();
         t->key = key;
         t->value = ValueType();
         t->bf = BST_IN_BALANCE;
         t->left = t->right = NULL;
         heightFlag = true;
         nodeCount++;
         return &t->value;
      }
      int sign = compareKeys(key, t->key);
      if (sign == 0) return &t->value;
      ValueType *vp = NULL;
      int bfDelta = BST_IN_BALANCE;
      if (sign < 0) {
         vp = addNode(t->left, key, heightFlag);
         if (heightFlag) bfDelta = BST_LEFT_HEAVY;
      } else {
         vp = addNode(t->right, key, heightFlag);
         if (heightFlag) bfDelta = BST_RIGHT_HEAVY;
      }
      updateBF(t, bfDelta);
      heightFlag = (bfDelta != 0 && t->bf != BST_IN_BALANCE);
      return vp;
   }